

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ls.h
# Opt level: O3

void __thiscall
wabt::LoadStoreTracking::LoadStore
          (LoadStoreTracking *this,uint64_t offset,Opcode opc,Type type,Address align,Node *addr_exp
          )

{
  short sVar1;
  Address AVar2;
  undefined8 uVar3;
  bool bVar4;
  size_t sVar5;
  ulong uVar6;
  mapped_type *this_00;
  mapped_type *pmVar7;
  long lVar8;
  long extraout_RDX;
  ulong uVar9;
  char *pcVar10;
  Type TVar11;
  string name;
  Opcode local_90;
  Opcode local_8c;
  Address local_88;
  uint64_t local_80;
  undefined1 local_78 [48];
  Address local_48;
  
  local_90.enum_ = opc.enum_;
  local_80 = offset;
  Opcode::GetInfo((Info *)local_78,&local_90);
  local_88 = local_48;
  local_8c.enum_ = local_90.enum_;
  if ((type.enum_ & I64) == I64) {
    Opcode::GetInfo((Info *)local_78,&local_8c);
    uVar3 = local_78._0_8_;
    sVar5 = strlen((char *)local_78._0_8_);
    if (sVar5 < 2) {
      pcVar10 = "%s: __pos (which is %zu) > __size (which is %zu)";
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 sVar5 - 2,sVar5);
      if (*(int *)(extraout_RDX + 4) == 0x1a) {
        lVar8 = *(long *)(extraout_RDX + 8);
        if (*(int *)(lVar8 + 0x38) != 0x1a) {
          pcVar10 = 
          "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::LocalTee>, Base = wabt::Expr]"
          ;
          goto LAB_00132302;
        }
      }
      else {
        if (*(int *)(extraout_RDX + 4) != 0x18) {
          *(string **)pcVar10 = (string *)pcVar10 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)pcVar10,"");
          return;
        }
        lVar8 = *(long *)(extraout_RDX + 8);
        if (*(int *)(lVar8 + 0x38) != 0x18) {
          pcVar10 = 
          "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::LocalGet>, Base = wabt::Expr]"
          ;
LAB_00132302:
          __assert_fail("isa<Derived>(base)",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/cast.h"
                        ,0x48,pcVar10);
        }
      }
      if (*(int *)(lVar8 + 0x60) == 1) {
        *(string **)pcVar10 = (string *)pcVar10 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)pcVar10,*(long *)(lVar8 + 0x68),
                   *(long *)(lVar8 + 0x70) + *(long *)(lVar8 + 0x68));
        return;
      }
      __assert_fail("is_name()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/ir.h"
                    ,0x3f,"const std::string &wabt::Var::name() const");
    }
    sVar1 = *(short *)(uVar3 + (sVar5 - 2));
    Opcode::GetInfo((Info *)local_78,&local_8c);
    if (local_48 == 4) {
      uVar6 = 0xffffffff;
      uVar9 = 7;
    }
    else if (local_48 == 2) {
      uVar6 = 0xfffffff9;
      uVar9 = 6;
    }
    else {
      if (local_48 != 1) goto LAB_00132103;
      uVar6 = 0xfffffffa;
      uVar9 = 4;
    }
    if (sVar1 != 0x755f) {
      uVar9 = uVar6;
    }
    uVar6 = 0;
  }
  else {
LAB_00132103:
    uVar6 = (ulong)type & 0xffffffff00000000;
    uVar9 = (ulong)type & 0xffffffff;
  }
  AddrExpName_abi_cxx11_((string *)local_78,this,addr_exp);
  if ((char *)local_78._8_8_ != (char *)0x0) {
    TVar11 = (Type)(uVar6 | uVar9);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
              ::operator[](&this->vars,(key_type *)local_78);
    pmVar7 = std::
             map<unsigned_long,_wabt::LoadStoreTracking::LSAccess,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wabt::LoadStoreTracking::LSAccess>_>_>
             ::operator[](&this_00->accesses,&local_80);
    AVar2 = local_88;
    if ((pmVar7->byte_size != 0) &&
       (((pmVar7->byte_size != local_88 || (pmVar7->type != TVar11)) || (pmVar7->align != align))))
    {
      pmVar7->is_uniform = false;
    }
    bVar4 = Opcode::IsNaturallyAligned(&local_90,align);
    if (!bVar4) {
      pmVar7->is_uniform = false;
    }
    pmVar7->byte_size = AVar2;
    pmVar7->type = TVar11;
    pmVar7->align = align;
    if ((this_00->same_type == TVar11 || (this_00->same_type).enum_ == Any) &&
       (this_00->same_align == align || this_00->same_align == 0xffffffffffffffff)) {
      this_00->same_type = TVar11;
      this_00->same_align = align;
      (this_00->last_opc).enum_ = local_90.enum_;
    }
    else {
      (this_00->same_type).enum_ = Void;
      (this_00->same_type).type_index_ = 0;
      this_00->same_align = 0xffffffffffffffff;
    }
  }
  if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  return;
}

Assistant:

void LoadStore(uint64_t offset,
                 Opcode opc,
                 Type type,
                 Address align,
                 const Node& addr_exp) {
    auto byte_size = opc.GetMemorySize();
    type = GetMemoryType(type, opc);
    // We want to associate memory ops of a certain offset & size as being
    // relative to a uniquely identifiable pointer, such as a local.
    auto name = AddrExpName(addr_exp);
    if (name.empty()) {
      return;
    }
    auto& var = vars[name];
    auto& access = var.accesses[offset];
    // Check if previous access at this offset (if any) is of same size
    // and type (see Checklayouts below).
    if (access.byte_size && ((access.byte_size != byte_size) ||
                             (access.type != type) || (access.align != align)))
      access.is_uniform = false;
    // Also exclude weird alignment accesses from structs.
    if (!opc.IsNaturallyAligned(align))
      access.is_uniform = false;
    access.byte_size = byte_size;
    access.type = type;
    access.align = align;
    // Additionally, check if all accesses are to the same type, so
    // if layout check fails, we can at least declare it as pointer to
    // a type.
    if ((var.same_type == type || var.same_type == Type::Any) &&
        (var.same_align == align || var.same_align == kInvalidAddress)) {
      var.same_type = type;
      var.same_align = align;
      var.last_opc = opc;
    } else {
      var.same_type = Type::Void;
      var.same_align = kInvalidAddress;
    }
  }